

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O2

bool __thiscall FScanner::CheckNumber(FScanner *this)

{
  char *__s1;
  bool bVar1;
  int iVar2;
  long lVar3;
  char *stopper;
  char *local_20;
  
  bVar1 = GetString(this);
  if (bVar1) {
    __s1 = this->String;
    if (*__s1 != '\0') {
      iVar2 = strcmp(__s1,"MAXINT");
      if (iVar2 == 0) {
        this->Number = 0x7fffffff;
        iVar2 = 0x7fffffff;
LAB_00480de9:
        this->Float = (double)iVar2;
        return true;
      }
      lVar3 = strtol(__s1,&local_20,0);
      iVar2 = (int)lVar3;
      this->Number = iVar2;
      if (*local_20 == '\0') goto LAB_00480de9;
    }
    this->AlreadyGot = true;
    this->AlreadyGotLine = this->LastGotLine;
  }
  return false;
}

Assistant:

bool FScanner::CheckNumber ()
{
	char *stopper;

	if (GetString())
	{
		if (String[0] == 0)
		{
			UnGet();
			return false;
		}
		else if (strcmp (String, "MAXINT") == 0)
		{
			Number = INT_MAX;
		}
		else
		{
			Number = strtol (String, &stopper, 0);
			if (*stopper != 0)
			{
				UnGet();
				return false;
			}
		}
		Float = Number;
		return true;
	}
	else
	{
		return false;
	}
}